

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseNullCoalesce(Parser *this)

{
  int iVar1;
  pointer pTVar2;
  Node *left;
  int i;
  long lVar3;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  Node *n;
  vector<Token_*,_std::allocator<Token_*>_> opTokens;
  Node **local_68;
  iterator iStack_60;
  Node **local_58;
  Node *local_50;
  void *local_48;
  iterator iStack_40;
  Token **local_38;
  
  local_68 = (Node **)0x0;
  iStack_60._M_current = (Node **)0x0;
  local_58 = (Node **)0x0;
  local_38 = (Token **)0x0;
  local_48 = (void *)0x0;
  iStack_40._M_current = (Token **)0x0;
  do {
    local_50 = parseOr(this);
    if (local_50 == (Node *)0x0) {
LAB_001142ec:
      if (local_68 == iStack_60._M_current) {
        left = (Node *)0x0;
      }
      else {
        left = *local_68;
        if (1 < (int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 3)) {
          lVar3 = 1;
          do {
            left = createBinaryOpNode(this,*(Token **)((long)local_48 + lVar3 * 8 + -8),left,
                                      local_68[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 < (int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 3));
        }
      }
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if (local_68 != (Node **)0x0) {
        operator_delete(local_68);
      }
      return left;
    }
    iVar1 = this->pos;
    pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar2[iVar1].type != TK_NULLCOALESCE) {
      if (iStack_60._M_current == local_58) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&local_68,iStack_60,&local_50);
      }
      else {
        *iStack_60._M_current = local_50;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      goto LAB_001142ec;
    }
    pTVar2 = pTVar2 + iVar1;
    this->tok = pTVar2;
    this->pos = iVar1 + 1;
    if (iStack_40._M_current == local_38) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                ((vector<Token*,std::allocator<Token*>> *)&local_48,iStack_40,&this->tok);
    }
    else {
      *iStack_40._M_current = pTVar2;
      iStack_40._M_current = iStack_40._M_current + 1;
    }
    if (iStack_60._M_current == local_58) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&local_68,iStack_60,&local_50);
    }
    else {
      *iStack_60._M_current = local_50;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
  } while( true );
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }